

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

ByteData * __thiscall
cfd::TransactionController::CreateSignatureHash
          (ByteData *__return_storage_ptr__,TransactionController *this,Txid *txid,uint32_t vout,
          Pubkey *pubkey,SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  undefined4 uVar1;
  ByteData256 sighash;
  Script script;
  void *local_a0 [3];
  void *local_88 [3];
  SigHashType local_6c [12];
  Script local_60;
  
  cfd::core::ScriptUtil::CreateP2pkhLockingScript((Pubkey *)&local_60);
  uVar1 = cfd::core::Transaction::GetTxInIndex((Txid *)&this->transaction_,(uint)txid);
  cfd::core::Script::GetData();
  cfd::core::SigHashType::SigHashType(local_6c,sighash_type);
  cfd::core::Transaction::GetSignatureHash
            (local_88,&this->transaction_,uVar1,local_a0,local_6c,value,version);
  if (local_a0[0] != (void *)0x0) {
    operator_delete(local_a0[0]);
  }
  cfd::core::ByteData256::GetBytes();
  cfd::core::ByteData::ByteData(__return_storage_ptr__,(vector *)local_a0);
  if (local_a0[0] != (void *)0x0) {
    operator_delete(local_a0[0]);
  }
  if (local_88[0] != (void *)0x0) {
    operator_delete(local_88[0]);
  }
  core::Script::~Script(&local_60);
  return __return_storage_ptr__;
}

Assistant:

ByteData TransactionController::CreateSignatureHash(
    const Txid& txid, uint32_t vout, const Pubkey& pubkey,
    SigHashType sighash_type, const Amount& value,
    WitnessVersion version) const {
  Script script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);
  ByteData256 sighash = transaction_.GetSignatureHash(
      txin_index, script.GetData(), sighash_type, value, version);
  return ByteData(sighash.GetBytes());
}